

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O0

bool __thiscall
ec::base_protobuf::
out_length_delimited<std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>>
          (base_protobuf *this,uint8_t *pd,size_t len,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *pout)

{
  bool bVar1;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  *pout_local;
  size_t len_local;
  uint8_t *pd_local;
  base_protobuf *this_local;
  
  bVar1 = out_varint<unsigned_long,std::__cxx11::basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>,void>
                    (this,len,pout);
  if (bVar1) {
    std::__cxx11::
    basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
    append(pout,pd,len);
  }
  return bVar1;
}

Assistant:

bool out_length_delimited(const uint8_t *pd, size_t len, _Out *pout) // out string, bytes
    {
        if (!out_varint(len, pout)) {
            return false;
        }

        try {
            pout->append(pd, len);
            return true;
        } catch (...) {
            _lasterr = pberr_memory;
            return false;
        }
    }